

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  Syntax SVar1;
  int iVar2;
  string *psVar3;
  ulong uVar4;
  char *value;
  FileDescriptor *this_00;
  Descriptor *this_01;
  DescriptorProto *proto_00;
  EnumDescriptor *this_02;
  EnumDescriptorProto *proto_01;
  ServiceDescriptor *this_03;
  ServiceDescriptorProto *proto_02;
  FieldDescriptor *this_04;
  FieldDescriptorProto *proto_03;
  FileOptions *pFVar5;
  FileOptions *pFVar6;
  int local_34;
  int local_30;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  FileDescriptorProto *proto_local;
  FileDescriptor *this_local;
  
  psVar3 = name_abi_cxx11_(this);
  FileDescriptorProto::set_name(proto,psVar3);
  package_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar3 = package_abi_cxx11_(this);
    FileDescriptorProto::set_package(proto,psVar3);
  }
  SVar1 = syntax(this);
  if (SVar1 == SYNTAX_PROTO3) {
    SVar1 = syntax(this);
    value = SyntaxName(SVar1);
    FileDescriptorProto::set_syntax(proto,value);
  }
  i_2 = 0;
  while( true ) {
    iVar2 = dependency_count(this);
    if (iVar2 <= i_2) break;
    this_00 = dependency(this,i_2);
    psVar3 = name_abi_cxx11_(this_00);
    FileDescriptorProto::add_dependency(proto,psVar3);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar2 = public_dependency_count(this);
    if (iVar2 <= i_3) break;
    FileDescriptorProto::add_public_dependency
              (proto,*(int32 *)(*(long *)(this + 0x40) + (long)i_3 * 4));
    i_3 = i_3 + 1;
  }
  i_4 = 0;
  while( true ) {
    iVar2 = weak_dependency_count(this);
    if (iVar2 <= i_4) break;
    FileDescriptorProto::add_weak_dependency
              (proto,*(int32 *)(*(long *)(this + 0x50) + (long)i_4 * 4));
    i_4 = i_4 + 1;
  }
  i_5 = 0;
  while( true ) {
    iVar2 = message_type_count(this);
    if (iVar2 <= i_5) break;
    this_01 = message_type(this,i_5);
    proto_00 = FileDescriptorProto::add_message_type(proto);
    Descriptor::CopyTo(this_01,proto_00);
    i_5 = i_5 + 1;
  }
  i_6 = 0;
  while( true ) {
    iVar2 = enum_type_count(this);
    if (iVar2 <= i_6) break;
    this_02 = enum_type(this,i_6);
    proto_01 = FileDescriptorProto::add_enum_type(proto);
    EnumDescriptor::CopyTo(this_02,proto_01);
    i_6 = i_6 + 1;
  }
  local_30 = 0;
  while( true ) {
    iVar2 = service_count(this);
    if (iVar2 <= local_30) break;
    this_03 = service(this,local_30);
    proto_02 = FileDescriptorProto::add_service(proto);
    ServiceDescriptor::CopyTo(this_03,proto_02);
    local_30 = local_30 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar2 = extension_count(this);
    if (iVar2 <= local_34) break;
    this_04 = extension(this,local_34);
    proto_03 = FileDescriptorProto::add_extension(proto);
    FieldDescriptor::CopyTo(this_04,proto_03);
    local_34 = local_34 + 1;
  }
  pFVar5 = options(this);
  pFVar6 = FileOptions::default_instance();
  if (pFVar5 != pFVar6) {
    pFVar5 = FileDescriptorProto::mutable_options(proto);
    pFVar6 = options(this);
    FileOptions::CopyFrom(pFVar5,pFVar6);
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) proto->set_package(package());
  // TODO(liujisi): Also populate when syntax="proto2".
  if (syntax() == SYNTAX_PROTO3) proto->set_syntax(SyntaxName(syntax()));

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }

  if (&options() != &FileOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}